

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void sarima_setCSSML(sarima_object obj,int cssml)

{
  int cssml_local;
  sarima_object obj_local;
  
  if (cssml == 1) {
    obj->cssml = 1;
  }
  else {
    if (cssml != 0) {
      printf("cssml only accepts two values 1 and 0 \n");
      exit(-1);
    }
    obj->cssml = 0;
  }
  return;
}

Assistant:

void sarima_setCSSML(sarima_object obj, int cssml) {
	/*
	Uses CSS before MLE if cssml = 1.
	Only uses MLE if cssml = 0
	Only applicable with method 0
	*/

	if (cssml == 1) {
		obj->cssml = 1;
	} else if (cssml == 0) {
		obj->cssml = 0;
	} else {
		printf("cssml only accepts two values 1 and 0 \n");
		exit(-1);
	}

}